

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall
sglr::GLContext::blitFramebuffer
          (GLContext *this,int srcX0,int srcY0,int srcX1,int srcY1,int dstX0,int dstY0,int dstX1,
          int dstY1,deUint32 mask,deUint32 filter)

{
  ostringstream *stream;
  ostringstream *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  int iVar3;
  MessageBuilder *this_01;
  undefined4 extraout_var;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  Bitfield<16UL> local_1d8;
  Enum<int,_2UL> local_1c0;
  MessageBuilder local_1b0;
  
  dVar1 = this->m_drawFramebufferBinding;
  iVar3 = (this->m_baseViewport).m_data[0];
  iVar7 = (this->m_baseViewport).m_data[1];
  dVar2 = this->m_readFramebufferBinding;
  if ((this->m_logFlags & 1) != 0) {
    local_1b0.m_log = this->m_log;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"glBlitFramebuffer(");
    std::ostream::operator<<(this_00,srcX0);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,srcY0);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,srcX1);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,srcY1);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,dstX0);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,dstY0);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,dstX1);
    std::operator<<((ostream *)this_00,", ");
    std::ostream::operator<<(this_00,dstY1);
    std::operator<<((ostream *)this_00,", ");
    glu::getBufferMaskStr(&local_1d8,mask);
    this_01 = tcu::MessageBuilder::operator<<(&local_1b0,&local_1d8);
    stream = &this_01->m_str;
    std::operator<<((ostream *)stream,", ");
    local_1c0.m_getName = glu::getTextureFilterName;
    local_1c0.m_value = filter;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)stream);
    std::operator<<((ostream *)stream,")");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  bVar8 = dVar2 == 0;
  iVar4 = 0;
  if (bVar8) {
    iVar4 = iVar7;
  }
  iVar6 = 0;
  if (bVar8) {
    iVar6 = iVar3;
  }
  bVar8 = dVar1 != 0;
  if (bVar8) {
    iVar7 = 0;
  }
  iVar5 = 0;
  if (!bVar8) {
    iVar5 = iVar3;
  }
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x140))
            (srcX0 + iVar6,srcY0 + iVar4,iVar6 + srcX1,iVar4 + srcY1,dstX0 + iVar5,dstY0 + iVar7,
             iVar5 + dstX1,iVar7 + dstY1,mask,filter);
  return;
}

Assistant:

void GLContext::blitFramebuffer (int srcX0, int srcY0, int srcX1, int srcY1, int dstX0, int dstY0, int dstX1, int dstY1, deUint32 mask, deUint32 filter)
{
	tcu::IVec2	drawOffset	= getDrawOffset();
	tcu::IVec2	readOffset	= getReadOffset();

	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glBlitFramebuffer("
								  << srcX0 << ", " << srcY0 << ", " << srcX1 << ", " << srcY1 << ", "
								  << dstX0 << ", " << dstY0 << ", " << dstX1 << ", " << dstY1 << ", "
								  << glu::getBufferMaskStr(mask) << ", "
								  << glu::getTextureFilterStr(filter) << ")"
			  << TestLog::EndMessage;

	m_context.getFunctions().blitFramebuffer(readOffset.x()+srcX0, readOffset.y()+srcY0, readOffset.x()+srcX1, readOffset.y()+srcY1,
											 drawOffset.x()+dstX0, drawOffset.y()+dstY0, drawOffset.x()+dstX1, drawOffset.y()+dstY1,
											 mask, filter);
}